

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnBrIfExpr
          (ExprVisitorDelegate *this,BrIfExpr *expr)

{
  WatWriter *this_00;
  Info local_58;
  
  this_00 = this->writer_;
  Opcode::GetInfo(&local_58,(Opcode *)&Opcode::BrIf_Opcode);
  WritePuts(this_00,local_58.name,Space);
  WriteBrVar(this->writer_,&expr->var,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnBrIfExpr(BrIfExpr* expr) {
  writer_->WritePutsSpace(Opcode::BrIf_Opcode.GetName());
  writer_->WriteBrVar(expr->var, NextChar::Newline);
  return Result::Ok;
}